

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.c
# Opt level: O1

void sokoban_detect(level *lev)

{
  rm *prVar1;
  trap *ptVar2;
  schar sVar3;
  boolean bVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  obj *poVar8;
  long lVar9;
  
  lVar7 = 1;
  do {
    lVar9 = 0;
    do {
      prVar1 = lev->locations[lVar7] + lVar9;
      prVar1->seenv = 0xff;
      if (prVar1->typ == '\x0f') {
        sVar3 = '\x17';
LAB_00163807:
        prVar1->typ = sVar3;
      }
      else if (prVar1->typ == '\x10') {
        sVar3 = '\x18';
        goto LAB_00163807;
      }
      uVar5 = 0x800;
      if (prVar1->typ == '\x18') {
        uVar5 = *(int *)&prVar1->field_0x6 * 2 & 0x800;
      }
      *(uint *)&prVar1->field_0x6 = *(uint *)&prVar1->field_0x6 & 0xfffff7ff | uVar5;
      uVar5 = back_to_cmap(lev,(xchar)lVar7,(xchar)lVar9);
      *(uint *)prVar1 = *(uint *)prVar1 & 0xffffffc0 | uVar5 & 0x3f;
      *(uint *)&prVar1->field_0x6 =
           (uint)(uVar5 - 0x19 < 4) * 3 | *(uint *)&prVar1->field_0x6 & 0xfffffffc;
      for (poVar8 = lev->objects[lVar7][lVar9]; poVar8 != (obj *)0x0;
          poVar8 = (poVar8->v).v_nexthere) {
        if (poVar8->otyp == 0x214) {
          uVar5 = 0x10a800;
          if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
             ((u.umonnum == u.umonster || (bVar4 = dmgtype(youmonst.data,0x24), bVar4 == '\0')))) {
            iVar6 = display_rng(0x219);
            uVar5 = iVar6 * 0x800 + 0x1000U & 0x1ff800;
          }
          *(uint *)prVar1 = *(uint *)prVar1 & 0xffe007ff | uVar5;
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x15);
    lVar7 = lVar7 + 1;
    if (lVar7 == 0x50) {
      for (ptVar2 = lev->lev_traps; ptVar2 != (trap *)0x0; ptVar2 = ptVar2->ntrap) {
        ptVar2->field_0x8 = ptVar2->field_0x8 | 0x20;
        if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
           ((u.umonnum != u.umonster && (bVar4 = dmgtype(youmonst.data,0x24), bVar4 != '\0')))) {
          uVar5 = (uint)(byte)ptVar2->field_0x8;
        }
        else {
          iVar6 = display_rng(0x18);
          uVar5 = iVar6 + 1;
        }
        *(uint *)(lev->locations[ptVar2->tx] + ptVar2->ty) =
             *(uint *)(lev->locations[ptVar2->tx] + ptVar2->ty) & 0xfffff83f | (uVar5 & 0x1f) << 6;
      }
      return;
    }
  } while( true );
}

Assistant:

void sokoban_detect(struct level *lev)
{
	int x, y;
	struct trap *ttmp;
	struct obj *obj;

	/* Map the background and boulders */
	for (x = 1; x < COLNO; x++)
	    for (y = 0; y < ROWNO; y++) {
		struct rm *loc = &lev->locations[x][y];
		int cmap;

		/* Set seen vector for all locations so travelling works
		 * on pre-mapped levels. */
		loc->seenv = SVALL;
		if (loc->typ == SDOOR)
		    loc->typ = DOOR;
		else if (loc->typ == SCORR)
		    loc->typ = CORR;
		loc->waslit = (loc->typ != CORR) ? TRUE : loc->lit;
		cmap = back_to_cmap(lev, x, y);

		loc->mem_bg = cmap;
		if (cmap == S_vodoor || cmap == S_hodoor ||
		    cmap == S_vcdoor || cmap == S_hcdoor) {
		    lev->locations[x][y].mem_door_l = 1;
		    lev->locations[x][y].mem_door_t = 1;
		} else {
		    lev->locations[x][y].mem_door_l = 0;
		    lev->locations[x][y].mem_door_t = 0;
		}

		for (obj = lev->objects[x][y]; obj; obj = obj->nexthere)
		    if (obj->otyp == BOULDER)
			loc->mem_obj = what_obj(BOULDER) + 1;
	    }

	/* Map the traps */
	for (ttmp = lev->lev_traps; ttmp; ttmp = ttmp->ntrap) {
	    ttmp->tseen = 1;
	    lev->locations[ttmp->tx][ttmp->ty].mem_trap = what_trap(ttmp->ttyp);
	}
}